

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_regular_terminal
          (CATNMachine<wchar_t> *this,NFA<wchar_t> *nfa,int origin,int tag)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  NFABaseState<wchar_t,_int> *pNVar4;
  int local_58;
  int i;
  CharClass<wchar_t> local_48;
  int local_24;
  int local_20;
  int offset;
  int tag_local;
  int origin_local;
  NFA<wchar_t> *nfa_local;
  CATNMachine<wchar_t> *this_local;
  
  local_20 = tag;
  offset = origin;
  _tag_local = &nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>;
  nfa_local = (NFA<wchar_t> *)this;
  sVar2 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
          ::size(&this->m_nodes);
  local_24 = (int)sVar2;
  CharClass<wchar_t>::CharClass(&local_48);
  add_node(this,&local_48,offset,local_20);
  CharClass<wchar_t>::~CharClass(&local_48);
  pvVar3 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
           ::back(&this->m_nodes);
  pNVar4 = NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::get_state(_tag_local,0);
  CATNNode<wchar_t>::import_transitions(pvVar3,pNVar4,local_24);
  local_58 = 1;
  while( true ) {
    iVar1 = NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::get_state_num(_tag_local);
    if (iVar1 <= local_58) break;
    std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
    emplace_back<>(&this->m_nodes);
    pvVar3 = std::
             vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>::
             back(&this->m_nodes);
    pNVar4 = NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::get_state(_tag_local,local_58);
    CATNNode<wchar_t>::import_transitions(pvVar3,pNVar4,local_24);
    local_58 = local_58 + 1;
  }
  sVar2 = std::vector<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
          ::size(&this->m_nodes);
  return (int)sVar2 + -1;
}

Assistant:

int import_regular_terminal(const NFA<TCHAR>& nfa, int origin, int tag)
    {
        int offset = m_nodes.size();
        add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes.back().import_transitions(nfa.get_state(0), offset);
        for (int i = 1; i < nfa.get_state_num(); i++)
        {
            m_nodes.emplace_back();
            m_nodes.back().import_transitions(nfa.get_state(i), offset);
        }
        return m_nodes.size() - 1;
    }